

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

DoWhileStatementSyntax * __thiscall
slang::parsing::Parser::parseDoWhileStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  StatementSyntax *statement;
  ExpressionSyntax *expr;
  DoWhileStatementSyntax *pDVar1;
  Token doKeyword;
  Token whileKeyword;
  Token openParen;
  Token closeParen;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  doKeyword = ParserBase::consume(&this->super_ParserBase);
  statement = parseStatement(this,true,false);
  whileKeyword = ParserBase::expect(&this->super_ParserBase,WhileKeyword);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  expr = parseExpression(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b0da0;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pDVar1 = slang::syntax::SyntaxFactory::doWhileStatement
                     (&this->factory,label,&local_68,doKeyword,statement,whileKeyword,openParen,expr
                      ,closeParen,semi);
  return pDVar1;
}

Assistant:

DoWhileStatementSyntax& Parser::parseDoWhileStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto doKeyword = consume();
    auto& statement = parseStatement();
    auto whileKeyword = expect(TokenKind::WhileKeyword);
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto semi = expect(TokenKind::Semicolon);
    return factory.doWhileStatement(label, attributes, doKeyword, statement, whileKeyword,
                                    openParen, expr, closeParen, semi);
}